

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

void __thiscall
Js::CustomExternalWrapperObject::CustomExternalWrapperObject
          (CustomExternalWrapperObject *this,CustomExternalWrapperObject *instance,bool deepCopy)

{
  Type TVar1;
  CustomExternalWrapperObject *ptr;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,&instance->super_DynamicObject,deepCopy);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01390610;
  this->initialized = instance->initialized;
  this->u = (Type)0x0;
  if ((instance->slotType == External) || ((instance->u).inlineSlotSize == 0)) {
    this->slotType = External;
    ptr = (CustomExternalWrapperObject *)0x0;
    if (instance->slotType != External) {
      ptr = instance + 1;
    }
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&(this->u).slot,ptr);
    return;
  }
  this->slotType = Inline;
  TVar1 = 0;
  if (instance->slotType != External) {
    TVar1 = (instance->u).inlineSlotSize;
  }
  (this->u).inlineSlotSize = TVar1;
  if ((instance + 1 != (CustomExternalWrapperObject *)0x0) && (instance->slotType != External)) {
    memcpy_s(this + 1,(long)(int)TVar1,instance + 1,(long)(int)(instance->u).inlineSlotSize);
    return;
  }
  return;
}

Assistant:

CustomExternalWrapperObject::CustomExternalWrapperObject(CustomExternalWrapperObject * instance, bool deepCopy) :
    Js::DynamicObject(instance, deepCopy),
    initialized(instance->initialized)
{
    if (instance->GetInlineSlotSize() != 0)
    {
        this->slotType = SlotType::Inline;
        this->u.inlineSlotSize = instance->GetInlineSlotSize();
        if (instance->GetInlineSlots())
        {
            memcpy_s(this->GetInlineSlots(), this->GetInlineSlotSize(), instance->GetInlineSlots(), instance->GetInlineSlotSize());
        }
    }
    else
    {
        this->slotType = SlotType::External;
        this->u.slot = instance->GetInlineSlots();
    }
}